

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void pnga_access_block_grid_idx(Integer g_a,Integer *subscript,AccessIndex *index,Integer *ld)

{
  long icode;
  short sVar1;
  int iVar2;
  long icode_00;
  Integer IVar3;
  SingleComplex **ppSVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  DoubleComplex *pDVar8;
  char *ptr;
  ulong local_38;
  
  icode = g_a + 1000;
  sVar1 = GA[icode].ndim;
  if (0 < (long)sVar1) {
    lVar7 = 0;
    do {
      icode_00 = subscript[lVar7];
      if ((icode_00 < 0) || (GA[g_a + 1000].num_blocks[lVar7] <= icode_00)) {
        pnga_error("index outside allowed values",icode_00);
      }
      lVar7 = lVar7 + 1;
    } while (sVar1 != lVar7);
  }
  pnga_access_block_grid_ptr(g_a,subscript,&local_38,ld);
  iVar2 = GA[icode].elemsize;
  IVar3 = pnga_type_c2f((long)GA[icode].type);
  switch(IVar3) {
  case 0x3f2:
    ppSVar4 = (SingleComplex **)&INT_MB;
    break;
  default:
    pDVar8 = (DoubleComplex *)0x0;
    goto LAB_0017977d;
  case 0x3f4:
    lVar7 = (long)(local_38 - (long)FLT_MB) >> 2;
    pDVar8 = (DoubleComplex *)FLT_MB;
    goto LAB_00179775;
  case 0x3f5:
    ppSVar4 = (SingleComplex **)&DBL_MB;
    break;
  case 0x3f6:
    ppSVar4 = &SCPL_MB;
    break;
  case 0x3f7:
    lVar7 = (long)(local_38 - (long)DCPL_MB) >> 4;
    pDVar8 = DCPL_MB;
    goto LAB_00179775;
  }
  pDVar8 = (DoubleComplex *)*ppSVar4;
  lVar7 = (long)(local_38 - (long)pDVar8) >> 3;
LAB_00179775:
  *index = lVar7;
LAB_0017977d:
  uVar5 = local_38 % (ulong)(long)iVar2;
  uVar6 = (ulong)pDVar8 % (ulong)(long)iVar2;
  if (uVar5 != uVar6) {
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(ulong)(uint)GAme,local_38,uVar5,pDVar8,uVar6);
    pnga_error("nga_access: MA addressing problem: base address misallignment",icode);
  }
  *index = *index + 1;
  return;
}

Assistant:

void pnga_access_block_grid_idx(Integer g_a, Integer* subscript,
                                AccessIndex *index, Integer *ld)
{
char     *ptr;
Integer  handle = GA_OFFSET + g_a;
Integer  i,ndim/*,p_handle*/;
unsigned long    elemsize;
unsigned long    lref=0, lptr;

   
   /*p_handle = GA[handle].p_handle;*/
   ndim = GA[handle].ndim;
   for (i=0; i<ndim; i++) 
     if (subscript[i]<0 || subscript[i] >= GA[handle].num_blocks[i]) 
       pnga_error("index outside allowed values",subscript[i]);

   pnga_access_block_grid_ptr(g_a,subscript,&ptr,ld);
   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        
   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;
   FLUSH_CACHE;

}